

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O3

Light_EvalRes *
embree::Lights_eval(Light_EvalRes *__return_storage_ptr__,Light *self,DifferentialGeometry *dg,
                   Vec3fa *dir)

{
  undefined8 uVar1;
  Light_EvalRes *res;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  switch(self->type) {
  case LIGHT_AMBIENT:
    uVar1 = *(undefined8 *)(self + 6);
    *(undefined8 *)&(__return_storage_ptr__->value).field_0 = *(undefined8 *)(self + 4);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_0 + 8) = uVar1;
    __return_storage_ptr__->dist = INFINITY;
    fVar3 = (dg->Ns).field_0.m128[2] * (dir->field_0).m128[2] +
            (dg->Ns).field_0.m128[1] * (dir->field_0).m128[1] +
            (dg->Ns).field_0.m128[0] * (dir->field_0).m128[0];
    fVar2 = 0.0;
    if (0.0 <= fVar3) {
      fVar2 = fVar3;
    }
    __return_storage_ptr__->pdf = fVar2 / 3.1415927;
    break;
  case LIGHT_POINT:
    PointLight_eval(__return_storage_ptr__,self,dg,dir);
    break;
  case LIGHT_DIRECTIONAL:
    __return_storage_ptr__->dist = INFINITY;
    fVar2 = 0.0;
    fVar3 = 0.0;
    fVar4 = 0.0;
    fVar5 = 0.0;
    fVar6 = 0.0;
    if (((float)self[0x14].type < 0.9999999) &&
       ((float)self[0x14].type <
        (float)self[0xe].type * (dir->field_0).m128[2] +
        (float)self[0xd].type * (dir->field_0).m128[1] +
        (float)self[0xc].type * (dir->field_0).m128[0])) {
      fVar2 = (float)self[0x15].type;
      fVar3 = fVar2 * (float)self[0x10].type;
      fVar4 = fVar2 * (float)self[0x11].type;
      fVar5 = fVar2 * (float)self[0x12].type;
      fVar6 = fVar2 * (float)self[0x13].type;
    }
    (__return_storage_ptr__->value).field_0.m128[0] = fVar3;
    (__return_storage_ptr__->value).field_0.m128[1] = fVar4;
    (__return_storage_ptr__->value).field_0.m128[2] = fVar5;
    (__return_storage_ptr__->value).field_0.m128[3] = fVar6;
    __return_storage_ptr__->pdf = fVar2;
    break;
  case LIGHT_SPOT:
    SpotLight_eval(self,dg,dir);
    break;
  default:
    *(undefined8 *)&(__return_storage_ptr__->value).field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_0 + 8) = 0;
    __return_storage_ptr__->dist = INFINITY;
    __return_storage_ptr__->pdf = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Light_EvalRes Lights_eval(const Light* self,
                          const DifferentialGeometry& dg,
                          const Vec3fa& dir)
{
  TutorialLightType ty = self->type;
  switch (ty) {
  case LIGHT_AMBIENT     : return AmbientLight_eval(self,dg,dir);
  case LIGHT_POINT       : return PointLight_eval(self,dg,dir);
  case LIGHT_DIRECTIONAL : return DirectionalLight_eval(self,dg,dir);
  case LIGHT_SPOT        : return SpotLight_eval(self,dg,dir);
  case LIGHT_QUAD        : return QuadLight_eval(self,dg,dir);
  default: {
    Light_EvalRes res;
    res.value = Vec3fa(0,0,0);
    res.dist = inf;
    res.pdf = 0.f;
    return res;
  }
  }
}